

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  
LAB_0047a86c:
  do {
    while( true ) {
      pbVar4 = (byte *)ptr;
      if (pbVar4 == (byte *)end) {
        return -1;
      }
      bVar1 = *pbVar4;
      if (3 < bVar1 - 0xd8) break;
switchD_0047a8de_caseD_7:
      if ((long)end - (long)pbVar4 < 4) {
        return -2;
      }
      ptr = (char *)(pbVar4 + 4);
    }
    if (bVar1 != 0) {
      if (bVar1 == 0xff) {
        if (pbVar4[1] < 0xfe) goto switchD_0047a8de_caseD_2;
      }
      else if (3 < bVar1 - 0xdc) goto switchD_0047a8de_caseD_2;
switchD_0047a8de_caseD_0:
      *nextTokPtr = (char *)pbVar4;
      goto LAB_0047a916;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar4[1]);
    switch(bVar1) {
    case 0:
    case 1:
    case 8:
      goto switchD_0047a8de_caseD_0;
    case 5:
      if ((long)end - (long)pbVar4 < 2) {
        return -2;
      }
    default:
switchD_0047a8de_caseD_2:
      ptr = (char *)(pbVar4 + 2);
      break;
    case 6:
      if ((long)end - (long)pbVar4 < 3) {
        return -2;
      }
      ptr = (char *)(pbVar4 + 3);
      break;
    case 7:
      goto switchD_0047a8de_caseD_7;
    case 0xc:
    case 0xd:
      goto switchD_0047a8de_caseD_c;
    }
  } while( true );
switchD_0047a8de_caseD_c:
  ptr = (char *)(pbVar4 + 2);
  if ((uint)bVar1 == open) {
    if (ptr == end) {
      iVar2 = -0x1b;
    }
    else {
      *nextTokPtr = ptr;
      if (((*ptr == 0) &&
          (uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar4[3]), uVar3 < 0x1f)) &&
         ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0)) {
        iVar2 = 0x1b;
      }
      else {
LAB_0047a916:
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  goto LAB_0047a86c;
}

Assistant:

static
int PREFIX(scanLit)(int open, const ENCODING *enc,
                    const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  while (ptr != end) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (ptr == end)
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}